

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestApiConnection.cpp
# Opt level: O3

string * __thiscall
helics::apps::RestApiConnection::sendCommand
          (string *__return_storage_ptr__,RestApiConnection *this,verb command,string *target,
          string *body)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined8 __val;
  uint uVar3;
  status sVar4;
  ulong uVar5;
  uint uVar6;
  string_view target_;
  request<http::string_body> req;
  response<http::string_body> res;
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  mStack_1a8;
  undefined1 local_128 [8];
  rbtree_node<void_*> local_120;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_100;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> _Stack_f8;
  size_t local_f0;
  char *pcStack_e8;
  ulong local_e0;
  size_holder<true,_unsigned_long,_void> sStack_d8;
  undefined1 local_d0 [32];
  list_node<void_*> local_b0;
  size_t local_a0;
  char *pcStack_98;
  size_t local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined2 local_77;
  _Any_data local_70;
  _Manager_type local_60;
  _Invoker_type p_Stack_58;
  _Any_data local_50;
  _Manager_type local_40;
  _Invoker_type p_Stack_38;
  
  target_._M_str = (target->_M_dataplus)._M_p;
  target_._M_len = target->_M_string_length;
  boost::beast::http::header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::
  header<>(&mStack_1a8.super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>,
           command,target_,0xb);
  paVar1 = &mStack_1a8.
            super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
            .value_.field_2;
  mStack_1a8.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_string_length = 0;
  mStack_1a8.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_.field_2._M_local_buf[0] = '\0';
  local_120.parent_ = (node_ptr)(this->hostName)._M_dataplus._M_p;
  local_128 = (undefined1  [8])(this->hostName)._M_string_length;
  mStack_1a8.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_dataplus._M_p = (pointer)paVar1;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)&mStack_1a8,host,(string_view *)local_128);
  local_128 = (undefined1  [8])0x1a;
  local_120.parent_ = (node_ptr)0x437c74;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)&mStack_1a8,user_agent,(string_view *)local_128)
  ;
  if (body->_M_string_length != 0) {
    if (*(body->_M_dataplus)._M_p == '{') {
      local_128 = (undefined1  [8])0x10;
      local_120.parent_ = (node_ptr)0x422dbe;
      boost::beast::http::basic_fields<std::allocator<char>_>::set
                ((basic_fields<std::allocator<char>_> *)&mStack_1a8,content_type,
                 (string_view *)local_128);
    }
    else {
      local_128 = (undefined1  [8])0xa;
      local_120.parent_ = (node_ptr)0x422e06;
      boost::beast::http::basic_fields<std::allocator<char>_>::set
                ((basic_fields<std::allocator<char>_> *)&mStack_1a8,content_type,
                 (string_view *)local_128);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&mStack_1a8.
                super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                .value_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)body);
    boost::beast::http::
    message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::prepare_payload(&mStack_1a8);
  }
  boost::beast::http::
  write<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            ((this->stream)._M_t.
             super___uniq_ptr_impl<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_*,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
             .
             super__Head_base<0UL,_boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_*,_false>
             ._M_head_impl,&mStack_1a8);
  if (command == head) {
    local_d0._8_8_ = local_d0;
    local_120.parent_ = (node_ptr)CONCAT71(local_120.parent_._1_7_,1);
    local_120.left_ = (rbtree_node<void_*> *)0x800000;
    local_120.right_ = (rbtree_node<void_*> *)0x0;
    local_120._24_8_ = 0;
    local_100._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
    _Stack_f8._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
    local_f0 = 0;
    pcStack_e8 = (char *)CONCAT26(pcStack_e8._6_2_,0x2000);
    local_128 = (undefined1  [8])&PTR__parser_00548ac0;
    local_d0._0_8_ = (node_ptr)0x0;
    local_d0._24_8_ = 0;
    sStack_d8.size_ = 0;
    local_b0.next_ = &local_b0;
    local_a0 = 0;
    pcStack_98 = (char *)0x0;
    local_90 = 0;
    pcStack_88 = (char *)0x0;
    local_80._0_4_ = 0xb;
    local_80._4_4_ = ok;
    local_77._0_1_ = false;
    local_77._1_1_ = false;
    local_40 = (_Manager_type)0x0;
    p_Stack_38 = (_Invoker_type)0x0;
    local_50._M_unused._M_object = (void *)0x0;
    local_50._8_8_ = 0;
    local_60 = (_Manager_type)0x0;
    p_Stack_58 = (_Invoker_type)0x0;
    local_70._M_unused._M_object = (void *)0x0;
    local_70._8_8_ = 0;
    local_e0 = 0x100000000;
    local_d0._16_8_ = local_d0._8_8_;
    local_b0.prev_ = local_b0.next_;
    boost::beast::http::
    read<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::basic_flat_buffer<std::allocator<char>>,false>
              ((this->stream)._M_t.
               super___uniq_ptr_impl<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_*,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
               .
               super__Head_base<0UL,_boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_*,_false>
               ._M_head_impl,&this->buffer,(basic_parser<false> *)local_128);
    __val = local_120._24_8_;
    if ((local_e0 & 0x40000000000) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
    }
    else {
      uVar6 = 1;
      if (9 < (ulong)local_120._24_8_) {
        uVar5 = local_120._24_8_;
        uVar3 = 4;
        do {
          uVar6 = uVar3;
          if (uVar5 < 100) {
            uVar6 = uVar6 - 2;
            goto LAB_00230ae8;
          }
          if (uVar5 < 1000) {
            uVar6 = uVar6 - 1;
            goto LAB_00230ae8;
          }
          if (uVar5 < 10000) goto LAB_00230ae8;
          bVar2 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          uVar3 = uVar6 + 4;
        } while (bVar2);
        uVar6 = uVar6 + 1;
      }
LAB_00230ae8:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,(ulong)uVar6,'\0');
      CLI::std::__detail::__to_chars_10_impl<unsigned_long>
                ((__return_storage_ptr__->_M_dataplus)._M_p,
                 (uint)__return_storage_ptr__->_M_string_length,__val);
    }
    boost::beast::http::parser<false,_boost::beast::http::empty_body,_std::allocator<char>_>::
    ~parser((parser<false,_boost::beast::http::empty_body,_std::allocator<char>_> *)local_128);
  }
  else {
    local_120.left_ = &local_120;
    local_120.parent_ = (node_ptr)0x0;
    local_120._24_8_ = 0;
    local_128 = (undefined1  [8])0x0;
    local_100._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)&local_100;
    local_f0 = 0;
    pcStack_e8 = (char *)0x0;
    local_e0 = 0;
    sStack_d8.size_ = 0;
    local_d0._0_8_ = (node_ptr)0xc80000000b;
    local_d0._16_8_ = (node_ptr)0x0;
    local_d0._24_8_ = local_d0._24_8_ & 0xffffffffffffff00;
    local_120.right_ = local_120.left_;
    _Stack_f8._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         local_100._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    local_d0._8_8_ = local_d0 + 0x18;
    boost::beast::http::
    read<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::basic_flat_buffer<std::allocator<char>>,false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
              ((this->stream)._M_t.
               super___uniq_ptr_impl<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_*,_std::default_delete<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
               .
               super__Head_base<0UL,_boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_*,_false>
               ._M_head_impl,&this->buffer,
               (message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                *)local_128);
    sVar4 = boost::beast::http::int_to_status(local_d0._4_4_);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (sVar4 == not_found) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"#invalid","");
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_d0._8_8_,
                 (pointer)(local_d0._8_8_ + (long)(node_ptr *)local_d0._16_8_));
    }
    if ((undefined1 *)local_d0._8_8_ != local_d0 + 0x18) {
      operator_delete((void *)local_d0._8_8_,local_d0._24_8_ + 1);
    }
    boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
              ((basic_fields<std::allocator<char>_> *)local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mStack_1a8.
         super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
         .value_._M_dataplus._M_p != paVar1) {
    operator_delete(mStack_1a8.
                    super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                    .value_._M_dataplus._M_p,
                    CONCAT71(mStack_1a8.
                             super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                             .value_.field_2._M_allocated_capacity._1_7_,
                             mStack_1a8.
                             super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                             .value_.field_2._M_local_buf[0]) + 1);
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
            ((basic_fields<std::allocator<char>_> *)&mStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string RestApiConnection::sendCommand(http::verb command,
                                           const std::string& target,
                                           const std::string& body)
{
    // Set up an HTTP command message
    http::request<http::string_body> req{command, target, 11};
    req.set(http::field::host, hostName);
    req.set(http::field::user_agent, "HELICS_HTTP_RESTCONNECTION");
    if (!body.empty()) {
        if (body.front() == '{') {
            req.set(http::field::content_type, "application/json");
        } else {
            req.set(http::field::content_type, "text/plain");
        }
        req.body() = body;
        req.prepare_payload();
    }
    // Send the HTTP request to the remote host
    http::write(*stream, req);
    if (command == http::verb::head) {
        // Declare a container to hold the response
        http::response_parser<http::empty_body> res;
        res.skip(true);
        // Receive the HTTP response
        http::read(*stream, buffer, res);
        return (res.content_length()) ? std::to_string(*res.content_length()) : std::string("0");
    }
    // Declare a container to hold the response
    http::response<http::string_body> res;

    // Receive the HTTP response
    http::read(*stream, buffer, res);
    if (res.result() == http::status::not_found) {
        return "#invalid";
    }
    return res.body();
}